

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_zap(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  CHAR_DATA *obj_00;
  CHAR_DATA *arg2;
  char *pcVar5;
  char arg [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_1238);
  if ((local_1238[0] == '\0') && (ch->fighting == (CHAR_DATA *)0x0)) {
LAB_0025f0b8:
    pcVar5 = "Zap whom or what?\n\r";
LAB_0025f0bf:
    send_to_char(pcVar5,ch);
    return;
  }
  obj = get_eq_char(ch,0x11);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar5 = "You hold nothing in your hand.\n\r";
    goto LAB_0025f0bf;
  }
  if (obj->item_type != 3) {
    pcVar5 = "You can zap only with a wand.\n\r";
    goto LAB_0025f0bf;
  }
  if (local_1238[0] == '\0') {
    victim = ch->fighting;
    if (victim == (CHAR_DATA *)0x0) goto LAB_0025f0b8;
    obj_00 = (CHAR_DATA *)0x0;
  }
  else {
    victim = get_char_room(ch,local_1238);
    obj_00 = (CHAR_DATA *)get_obj_here(ch,local_1238);
    if (victim == (CHAR_DATA *)0x0 && obj_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "You can\'t find it.\n\r";
      goto LAB_0025f0bf;
    }
  }
  bVar1 = check_entwine(ch,1);
  if (bVar1) {
    pcVar5 = "You are too entwined to do that.\n\r";
    goto LAB_0025f0bf;
  }
  WAIT_STATE(ch,0x18);
  if (obj->value[2] < 1) {
    obj->value[2] = obj->value[2] + -1;
    goto LAB_0025f265;
  }
  if (victim == (CHAR_DATA *)0x0) {
    act("$n zaps $P with $p.",ch,obj,obj_00,0);
    pcVar5 = "You zap $P with $p.";
    iVar3 = 3;
    arg2 = obj_00;
  }
  else {
    act("$n zaps $N with $p.",ch,obj,victim,1);
    act("You zap $N with $p.",ch,obj,victim,3);
    pcVar5 = "$n zaps you with $p.";
    iVar3 = 2;
    arg2 = victim;
  }
  act(pcVar5,ch,obj,arg2,iVar3);
  if (ch->level < obj->level) {
LAB_0025f1fc:
    bVar1 = false;
    act("Your efforts with $p produce only smoke and sparks.",ch,obj,(void *)0x0,3);
    act("$n\'s efforts with $p produce only smoke and sparks.",ch,obj,(void *)0x0,0);
  }
  else {
    iVar3 = number_percent();
    iVar4 = get_skill(ch,(int)gsn_wands);
    if ((iVar4 << 2) / 5 + 0x14 <= iVar3) goto LAB_0025f1fc;
    bVar2 = check_deny_magic(ch);
    bVar1 = true;
    if (!bVar2) {
      obj_cast_spell(obj->value[3],obj->value[0],ch,victim,(OBJ_DATA *)obj_00);
    }
  }
  check_improve(ch,(int)gsn_wands,bVar1,2);
  iVar3 = obj->value[2];
  obj->value[2] = iVar3 + -1;
  if (1 < iVar3) {
    return;
  }
LAB_0025f265:
  act("$n\'s $p explodes into fragments.",ch,obj,(void *)0x0,0);
  act("Your $p explodes into fragments.",ch,obj,(void *)0x0,3);
  extract_obj(obj);
  return;
}

Assistant:

void do_zap(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *wand;
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0' && ch->fighting == nullptr)
	{
		send_to_char("Zap whom or what?\n\r", ch);
		return;
	}

	wand = get_eq_char(ch, WEAR_HOLD);

	if (wand == nullptr)
	{
		send_to_char("You hold nothing in your hand.\n\r", ch);
		return;
	}

	if (wand->item_type != ITEM_WAND)
	{
		send_to_char("You can zap only with a wand.\n\r", ch);
		return;
	}

	obj = nullptr;

	if (arg[0] == '\0')
	{
		if (ch->fighting != nullptr)
		{
			victim = ch->fighting;
		}
		else
		{
			send_to_char("Zap whom or what?\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, arg);
		obj = get_obj_here(ch, arg);

		if (victim == nullptr && obj == nullptr)
		{
			send_to_char("You can't find it.\n\r", ch);
			return;
		}
	}

	if (check_entwine(ch, 1))
	{
		send_to_char("You are too entwined to do that.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);

	if (wand->value[2] > 0)
	{
		if (victim != nullptr)
		{
			act("$n zaps $N with $p.", ch, wand, victim, TO_NOTVICT);
			act("You zap $N with $p.", ch, wand, victim, TO_CHAR);
			act("$n zaps you with $p.", ch, wand, victim, TO_VICT);
		}
		else
		{
			act("$n zaps $P with $p.", ch, wand, obj, TO_ROOM);
			act("You zap $P with $p.", ch, wand, obj, TO_CHAR);
		}

		if (ch->level < wand->level || number_percent() >= 20 + get_skill(ch, gsn_wands) * 4 / 5)
		{
			act("Your efforts with $p produce only smoke and sparks.", ch, wand, nullptr, TO_CHAR);
			act("$n's efforts with $p produce only smoke and sparks.", ch, wand, nullptr, TO_ROOM);
			check_improve(ch, gsn_wands, false, 2);
		}
		else
		{
			if (!check_deny_magic(ch))
				obj_cast_spell(wand->value[3], wand->value[0], ch, victim, obj);

			check_improve(ch, gsn_wands, true, 2);
		}
	}

	if (--wand->value[2] <= 0)
	{
		act("$n's $p explodes into fragments.", ch, wand, nullptr, TO_ROOM);
		act("Your $p explodes into fragments.", ch, wand, nullptr, TO_CHAR);
		extract_obj(wand);
	}
}